

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall Application::resize(Application *this)

{
  undefined8 *puVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  VkExtent2D VVar3;
  element_type *peVar4;
  _func_int **pp_Var5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  long lVar9;
  ulong uVar10;
  _func_int **local_38;
  element_type *peStack_30;
  
  peVar7 = (this->m_frame_manager).
           super___shared_ptr<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar8 = (peVar7->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar8->m_image_count != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      myvk::Framebuffer::Create
                ((Framebuffer *)&stack0xffffffffffffffc8,&this->m_render_pass,
                 (Ptr<ImageView> *)
                 ((long)&((peVar7->m_swapchain_image_views).
                          super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                         super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> + lVar9));
      peVar6 = peStack_30;
      pp_Var5 = local_38;
      psVar2 = (this->m_framebuffers).
               super__Vector_base<std::shared_ptr<myvk::Framebuffer>,_std::allocator<std::shared_ptr<myvk::Framebuffer>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (_func_int **)0x0;
      peStack_30 = (element_type *)0x0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(psVar2->super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_refcount._M_pi + lVar9);
      puVar1 = (undefined8 *)
               ((long)&(psVar2->super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + lVar9);
      *puVar1 = pp_Var5;
      puVar1[1] = peVar6;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (peStack_30 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_30);
      }
      uVar10 = uVar10 + 1;
      peVar7 = (this->m_frame_manager).
               super___shared_ptr<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar8 = (peVar7->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar9 = lVar9 + 0x10;
    } while (uVar10 < peVar8->m_image_count);
  }
  VVar3 = (peVar8->m_swapchain_create_info).imageExtent;
  ((this->m_camera).super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_aspect_ratio =
       (float)((ulong)VVar3 & 0xffffffff) / (float)((ulong)VVar3 >> 0x20);
  peVar4 = (this->m_path_tracer_viewer).
           super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4->m_width = VVar3.width;
  peVar4->m_height = VVar3.height;
  OctreeTracer::Resize
            ((this->m_octree_tracer).super___shared_ptr<OctreeTracer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,VVar3.width,VVar3.height);
  return;
}

Assistant:

void Application::resize() {
	for (uint32_t i = 0; i < m_frame_manager->GetSwapchain()->GetImageCount(); ++i) {
		m_framebuffers[i] = myvk::Framebuffer::Create(m_render_pass, m_frame_manager->GetSwapchainImageViews()[i]);
	}
	VkExtent2D extent = m_frame_manager->GetSwapchain()->GetExtent();
	m_camera->m_aspect_ratio = extent.width / float(extent.height);
	m_path_tracer_viewer->Resize(extent.width, extent.height);
	m_octree_tracer->Resize(extent.width, extent.height);
}